

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_compute_glyph_metrics_from_image
                (rf_image image,rf_color key,int *codepoints,rf_glyph_info *dst,
                rf_int codepoints_and_dst_count)

{
  rf_image image_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [20];
  int iVar3;
  rf_color rVar4;
  _Bool _Var5;
  int iVar6;
  rf_color rVar7;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  byte bVar8;
  undefined1 in_stack_ffffffffffffff87;
  int local_68;
  int char_width;
  int local_5c;
  int x_pos_to_read;
  int line_to_read;
  int index;
  int char_height;
  int local_44;
  rf_color pixel;
  int y;
  int x;
  int line_spacing;
  int char_spacing;
  int image_data_size;
  int bpp;
  _Bool result;
  rf_int codepoints_and_dst_count_local;
  rf_glyph_info *dst_local;
  int *codepoints_local;
  rf_color key_local;
  
  auVar2 = image._0_20_;
  image_data_size._3_1_ = false;
  if ((((((undefined1  [24])image & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) &&
       (codepoints != (int *)0x0)) && (dst != (rf_glyph_info *)0x0)) &&
     (0 < codepoints_and_dst_count)) {
    iVar6 = rf_bytes_per_pixel(image.format);
    auVar1 = image._8_16_;
    image_00.format = (int)in_stack_ffffffffffffff80;
    image_00.valid = (_Bool)(char)((uint6)in_stack_ffffffffffffff80 >> 0x20);
    image_00._21_1_ = (char)((uint6)in_stack_ffffffffffffff80 >> 0x28);
    image_00.data = (void *)auVar1._0_8_;
    image_00.width = auVar1._8_4_;
    image_00.height = auVar1._12_4_;
    image_00._22_1_ = in_stack_ffffffffffffff86;
    image_00._23_1_ = in_stack_ffffffffffffff87;
    rf_image_size(image_00);
    pixel.r = '\0';
    pixel.g = '\0';
    pixel.b = '\0';
    pixel.a = '\0';
    for (local_44 = 0; local_44 < image.height; local_44 = local_44 + 1) {
      memset(&char_height,0,4);
      pixel.r = '\0';
      pixel.g = '\0';
      pixel.b = '\0';
      pixel.a = '\0';
      for (; (int)pixel < image.width; pixel = (rf_color)((int)pixel + 1)) {
        char_height = (int)rf_format_one_pixel_to_rgba32
                                     ((void *)(auVar2 + (long)((local_44 * image.width + (int)pixel)
                                                              * iVar6)),image.format);
        _Var5 = rf_color_match((rf_color)char_height,key);
        if (!_Var5) break;
      }
      _Var5 = rf_color_match((rf_color)char_height,key);
      if (!_Var5) break;
    }
    rVar4 = pixel;
    iVar3 = local_44;
    index = 0;
    while( true ) {
      rVar7 = rf_format_one_pixel_to_rgba32
                        ((void *)(auVar2 + (long)(((iVar3 + index) * image.width + (int)rVar4) *
                                                 iVar6)),image.format);
      _Var5 = rf_color_match(rVar7,key);
      if (((_Var5 ^ 0xffU) & 1) == 0) break;
      index = index + 1;
    }
    x_pos_to_read = 0;
    for (local_5c = 0; rVar7 = pixel, pixel.r = rVar4.r, pixel.g = rVar4.g, pixel.b = rVar4.b,
        pixel.a = rVar4.a, char_width._0_1_ = pixel.r, char_width._1_1_ = pixel.g,
        char_width._2_1_ = pixel.b, char_width._3_1_ = pixel.a, pixel = rVar7,
        iVar3 + local_5c * (index + iVar3) < image.height &&
        x_pos_to_read < codepoints_and_dst_count; local_5c = local_5c + 1) {
      while( true ) {
        bVar8 = 0;
        if (char_width < image.width) {
          rVar7 = rf_format_one_pixel_to_rgba32
                            ((void *)(auVar2 + (long)(((iVar3 + (index + iVar3) * local_5c) *
                                                       image.width + char_width) * iVar6)),
                             image.format);
          _Var5 = rf_color_match(rVar7,key);
          bVar8 = _Var5 ^ 0xff;
        }
        if ((bVar8 & 1) == 0) break;
        local_68 = 0;
        while( true ) {
          rVar7 = rf_format_one_pixel_to_rgba32
                            ((void *)(auVar2 + (long)(((iVar3 + (index + iVar3) * local_5c) *
                                                       image.width + char_width + local_68) * iVar6)
                                     ),image.format);
          _Var5 = rf_color_match(rVar7,key);
          if (((_Var5 ^ 0xffU) & 1) == 0) break;
          local_68 = local_68 + 1;
        }
        dst[x_pos_to_read].codepoint = codepoints[x_pos_to_read];
        dst[x_pos_to_read].field_0.rec.x = (float)char_width;
        dst[x_pos_to_read].field_0.rec.y = (float)(iVar3 + local_5c * (index + iVar3));
        dst[x_pos_to_read].field_0.rec.width = (float)local_68;
        dst[x_pos_to_read].field_0.rec.height = (float)index;
        dst[x_pos_to_read].offset_x = 0;
        dst[x_pos_to_read].offset_y = 0;
        dst[x_pos_to_read].advance_x = 0;
        x_pos_to_read = x_pos_to_read + 1;
        char_width = local_68 + (int)rVar4 + char_width;
      }
    }
    image_data_size._3_1_ = true;
  }
  return image_data_size._3_1_;
}

Assistant:

RF_API bool rf_compute_glyph_metrics_from_image(rf_image image, rf_color key, const int* codepoints, rf_glyph_info* dst, rf_int codepoints_and_dst_count)
{
    bool result = false;

    if (image.valid && codepoints && dst && codepoints_and_dst_count > 0)
    {
        const int bpp = rf_bytes_per_pixel(image.format);
        const int image_data_size = rf_image_size(image);

        // This macro uses `bpp` and returns the pixel from the image at the index provided by calling rf_format_one_pixel_to_rgba32.
        #define RF_GET_PIXEL(index) rf_format_one_pixel_to_rgba32((char*)image.data + ((index) * bpp), image.format)

        // Parse image data to get char_spacing and line_spacing
        int char_spacing = 0;
        int line_spacing = 0;
        {
            int x = 0;
            int y = 0;
            for (y = 0; y < image.height; y++)
            {
                rf_color pixel = {0};
                for (x = 0; x < image.width; x++)
                {
                    pixel = RF_GET_PIXEL(y * image.width + x);
                    if (!rf_color_match(pixel, key)) break;
                }

                if (!rf_color_match(pixel, key)) break;
            }
            char_spacing = x;
            line_spacing = y;
        }

        // Compute char height
        int char_height = 0;
        {
            while (!rf_color_match(RF_GET_PIXEL((line_spacing + char_height) * image.width + char_spacing), key))
            {
                char_height++;
            }
        }

        // Check array values to get characters: value, x, y, w, h
        int index         = 0;
        int line_to_read  = 0;
        int x_pos_to_read = char_spacing;

        // Parse image data to get rectangle sizes
        while ((line_spacing + line_to_read * (char_height + line_spacing)) < image.height && index < codepoints_and_dst_count)
        {
            while (x_pos_to_read < image.width && !rf_color_match(RF_GET_PIXEL((line_spacing + (char_height + line_spacing) * line_to_read) * image.width + x_pos_to_read), key))
            {
                int char_width = 0;
                while (!rf_color_match(RF_GET_PIXEL(((line_spacing + (char_height + line_spacing) * line_to_read) * image.width + x_pos_to_read + char_width)), key)) {
                    char_width++;
                }

                dst[index].codepoint = codepoints[index];
                dst[index].x         = (float) x_pos_to_read;
                dst[index].y         = (float) (line_spacing + line_to_read * (char_height + line_spacing));
                dst[index].width     = (float) char_width;
                dst[index].height    = (float) char_height;

                // On image based fonts (XNA style), character offsets and x_advance are not required (set to 0)
                dst[index].offset_x  = 0;
                dst[index].offset_y  = 0;
                dst[index].advance_x = 0;

                index++;

                x_pos_to_read += (char_width + char_spacing);
            }

            line_to_read++;
            x_pos_to_read = char_spacing;
        }

        result = true;

        #undef RF_GET_PIXEL
    }

    return result;
}